

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<384,unsigned_long>
               (hashfunc<unsigned_long> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  size_type sVar3;
  byte in_CL;
  byte in_DL;
  char *pcVar4;
  uint in_ESI;
  byte in_R8B;
  byte in_R9B;
  bool result;
  unsigned_long h;
  keytype k;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  undefined4 in_stack_ffffffffffffff8c;
  byte bVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff90;
  Blob<384> *in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffffa7;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  pfHash in_stack_ffffffffffffffb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = in_DL & 1;
  local_e = in_CL & 1;
  local_f = in_R8B & 1;
  local_10 = in_R9B & 1;
  pcVar4 = "exactly";
  if ((in_DL & 1) != 0) {
    pcVar4 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x180,pcVar4,(ulong)in_ESI);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x147437);
  Blob<384>::Blob((Blob<384> *)&stack0xffffffffffffffa8);
  memset(&stack0xffffffffffffffa8,0,0x30);
  if ((local_d & 1) != 0) {
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    (*p_Var2)(&stack0xffffffffffffffa8,0x30,0,&stack0xffffffffffffff90);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_ffffffffffffff90,
               (value_type_conflict2 *)CONCAT44(in_stack_ffffffffffffff8c,in_ESI));
  }
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<384>,unsigned_long>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,
             (bool)in_stack_ffffffffffffffa7,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_28);
  printf("%d keys\n",sVar3 & 0xffffffff);
  bVar5 = 1;
  bVar1 = TestHashList<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                     hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish._7_1_,
                     hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish._6_1_,
                     hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish._5_1_,
                     hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish._4_1_,
                     hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish._3_1_);
  bVar5 = bVar1 & bVar5;
  printf("\n");
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_ffffffffffffff90);
  return (bool)(bVar5 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive, bool testColl, bool testDist, bool drawDiagram  )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits, inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashtype h;

    hash(&k,sizeof(keytype),0,&h);

    hashes.push_back(h);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}